

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader
          (LibraryKinematicsModelsLoader *this,IFilePartLoader *callingFilePartLoader)

{
  FilePartLoader::FilePartLoader(&this->super_FilePartLoader,callingFilePartLoader);
  FormulasLoader::FormulasLoader(&this->super_FormulasLoader);
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__LibraryKinematicsModelsLoader_0095c8f8;
  (this->super_FormulasLoader).super_HelperLoaderBase._vptr_HelperLoaderBase =
       (_func_int **)&PTR__LibraryKinematicsModelsLoader_0095cab8;
  JointsLoader::JointsLoader(&this->mJointsLoader);
  TransformationLoader::TransformationLoader(&this->mTransformationLoader);
  this->mCurrentKinematicsModel = (KinematicsModel *)0x0;
  this->mCurrentJointInstance = (KinematicInstance *)0x0;
  std::
  stack<COLLADASaxFWL::KinematicLink*,std::deque<COLLADASaxFWL::KinematicLink*,std::allocator<COLLADASaxFWL::KinematicLink*>>>
  ::
  stack<std::deque<COLLADASaxFWL::KinematicLink*,std::allocator<COLLADASaxFWL::KinematicLink*>>,void>
            (&this->mLinkStack);
  this->mCurrentAttachment = (KinematicAttachment *)0x0;
  (this->super_FormulasLoader).super_HelperLoaderBase.mHandlingFilePartLoader =
       &this->super_FilePartLoader;
  (this->mJointsLoader).super_HelperLoaderBase.mHandlingFilePartLoader = &this->super_FilePartLoader
  ;
  return;
}

Assistant:

LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader( IFilePartLoader* callingFilePartLoader )
		: FilePartLoader(callingFilePartLoader)
		, mCurrentKinematicsModel(0)
		, mCurrentJointInstance(0)
		, mCurrentAttachment(0)
	{
		FormulasLoader::setHandlingFilePartLoader(this);
		mJointsLoader.setHandlingFilePartLoader(this);
	}